

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void writeTiledRgbaMIP1(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  undefined4 uVar1;
  int iVar2;
  int yMax;
  int iVar3;
  Rgba *pRVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  int level;
  Array2D<Imf_3_2::Rgba> pixels;
  TiledRgbaOutputFile out;
  int iVar5;
  undefined4 in_stack_ffffffffffffff24;
  Vec2<float> *this;
  int xMax;
  int in_stack_ffffffffffffff3c;
  int h;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_60;
  Array2D<Imf_3_2::Rgba> local_50;
  Vec2<float> local_38;
  Rgba local_30 [6];
  
  this = &local_38;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  uVar1 = Imf_3_2::globalThreadCount();
  h = 3;
  xMax = 0;
  iVar5 = 0;
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_30,in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,1,0,0xf);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  pRVar4 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_50,0);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer(local_30,(ulong)pRVar4,1);
  local_60 = 0;
  while( true ) {
    iVar3 = local_60;
    iVar2 = Imf_3_2::TiledRgbaOutputFile::numLevels();
    if (iVar2 <= iVar3) break;
    Imf_3_2::TiledRgbaOutputFile::levelWidth((int)local_30);
    iVar2 = Imf_3_2::TiledRgbaOutputFile::levelHeight((int)local_30);
    Imf_3_2::TiledRgbaOutputFile::levelWidth((int)local_30);
    yMax = Imf_3_2::TiledRgbaOutputFile::levelHeight((int)local_30);
    iVar5 = local_60;
    drawImage4((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff4c,uVar1),
               in_stack_ffffffffffffff44,h,in_stack_ffffffffffffff3c,xMax,(int)((ulong)this >> 0x20)
               ,yMax,iVar2,iVar3);
    iVar3 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)local_30);
    iVar2 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)local_30);
    Imf_3_2::TiledRgbaOutputFile::writeTiles((int)local_30,0,iVar3 + -1,0,iVar2 + -1);
    local_60 = local_60 + 1;
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff24,iVar5));
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_30);
  return;
}

Assistant:

void
writeTiledRgbaMIP1 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with mipmap levels using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,    // tile size
        MIPMAP_LEVELS, // level mode
        ROUND_DOWN,    // rounding mode
        WRITE_RGBA);   // channels in file

    Array2D<Rgba> pixels (height, width);
    out.setFrameBuffer (&pixels[0][0], 1, width);

    for (int level = 0; level < out.numLevels (); ++level)
    {
        drawImage4 (
            pixels,
            out.levelWidth (level),
            out.levelHeight (level),
            0,
            out.levelWidth (level),
            0,
            out.levelHeight (level),
            level,
            level);

        out.writeTiles (
            0, out.numXTiles (level) - 1, 0, out.numYTiles (level) - 1, level);
    }
}